

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

void __thiscall Eigen::IOFormat::~IOFormat(IOFormat *this)

{
  std::__cxx11::string::~string((string *)&this->coeffSeparator);
  std::__cxx11::string::~string((string *)&this->rowSpacer);
  std::__cxx11::string::~string((string *)&this->rowSeparator);
  std::__cxx11::string::~string((string *)&this->rowSuffix);
  std::__cxx11::string::~string((string *)&this->rowPrefix);
  std::__cxx11::string::~string((string *)&this->matSuffix);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

IOFormat(int _precision = StreamPrecision, int _flags = 0,
    const std::string& _coeffSeparator = " ",
    const std::string& _rowSeparator = "\n", const std::string& _rowPrefix="", const std::string& _rowSuffix="",
    const std::string& _matPrefix="", const std::string& _matSuffix="", const char _fill=' ')
  : matPrefix(_matPrefix), matSuffix(_matSuffix), rowPrefix(_rowPrefix), rowSuffix(_rowSuffix), rowSeparator(_rowSeparator),
    rowSpacer(""), coeffSeparator(_coeffSeparator), fill(_fill), precision(_precision), flags(_flags)
  {
    // TODO check if rowPrefix, rowSuffix or rowSeparator contains a newline
    // don't add rowSpacer if columns are not to be aligned
    if((flags & DontAlignCols))
      return;
    int i = int(matSuffix.length())-1;
    while (i>=0 && matSuffix[i]!='\n')
    {
      rowSpacer += ' ';
      i--;
    }
  }